

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  float *pfVar4;
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  ulong *in_RSI;
  int in_EDI;
  uint in_R9D;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  float in_XMM0_Da;
  float rhs;
  double dVar8;
  float in_XMM1_Da;
  double v_cur_norm_curved;
  double v_new_norm_curved;
  double v_old_norm_curved;
  double v_old_ref_for_accum_remainder;
  unsigned_long_long v_cur;
  bool is_drag_direction_change_with_power;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_locked;
  bool is_power;
  bool is_clamped;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiContext *g;
  double in_stack_ffffffffffffff28;
  ImVec2 *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  float local_b8;
  bool local_af;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float local_90;
  unsigned_long_long in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  ImGuiDataType data_type_00;
  char *in_stack_ffffffffffffff88;
  char *local_70;
  ImVec2 *local_68;
  float local_4c;
  float local_14;
  bool local_1;
  
  pIVar2 = GImGui;
  data_type_00 = (ImGuiDataType)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  bVar6 = in_EDI == 8;
  bVar7 = in_EDI == 9;
  bVar5 = in_RDX < in_RCX;
  bVar1 = false;
  if ((((in_XMM1_Da != 1.0) || (NAN(in_XMM1_Da))) && (bVar1 = false, bVar6 || bVar7)) &&
     (bVar1 = false, bVar5)) {
    in_stack_ffffffffffffff6c = (float)((long)in_RCX - (long)in_RDX);
    local_90 = (float)(ulong)((long)in_RCX - (long)in_RDX);
    bVar1 = local_90 < 3.4028235e+38;
  }
  if (in_RCX < in_RDX) {
    local_1 = false;
  }
  else {
    local_14 = in_XMM0_Da;
    if (((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && (bVar5)) {
      in_stack_ffffffffffffff64 = (float)((long)in_RCX - (long)in_RDX);
      in_stack_ffffffffffffff68 = (float)(ulong)((long)in_RCX - (long)in_RDX);
      if (in_stack_ffffffffffffff68 < 3.4028235e+38) {
        in_stack_ffffffffffffff60 = (float)(ulong)((long)in_RCX - (long)in_RDX);
        local_14 = in_stack_ffffffffffffff60 * GImGui->DragSpeedDefaultRatio;
      }
    }
    local_4c = 0.0;
    if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
        (bVar3 = IsMousePosValid((ImVec2 *)
                                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
        !bVar3)) || ((pIVar2->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
        if (bVar6 || bVar7) {
          ImParseFormatPrecision
                    (in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
        }
        GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_ffffffffffffff6c,
                            (ImGuiInputReadMode)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                            in_stack_ffffffffffffff60);
        pfVar4 = ImVec2::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
        local_4c = *pfVar4;
        rhs = GetMinimumStepAtDecimalPrecision((int)in_stack_ffffffffffffff30);
        local_14 = ImMax<float>(local_14,rhs);
      }
    }
    else {
      pfVar4 = ImVec2::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      local_4c = *pfVar4;
      if (((pIVar2->IO).KeyAlt & 1U) != 0) {
        local_4c = local_4c * 0.01;
      }
      if (((pIVar2->IO).KeyShift & 1U) != 0) {
        local_4c = local_4c * 10.0;
      }
    }
    local_4c = local_14 * local_4c;
    if ((in_R9D & 1) != 0) {
      local_4c = -local_4c;
    }
    local_af = false;
    if ((bVar5) && (((ImVec2 *)*in_RSI < in_RCX || (local_af = true, local_4c <= 0.0)))) {
      local_af = (ImVec2 *)*in_RSI <= in_RDX && local_4c < 0.0;
    }
    bVar3 = false;
    if ((bVar1) &&
       (((0.0 <= local_4c || (bVar3 = true, pIVar2->DragCurrentAccum <= 0.0)) &&
        (bVar3 = false, 0.0 < local_4c)))) {
      bVar3 = pIVar2->DragCurrentAccum <= 0.0 && pIVar2->DragCurrentAccum != 0.0;
    }
    if ((((pIVar2->ActiveIdIsJustActivated & 1U) != 0) || (local_af)) || (bVar3)) {
      pIVar2->DragCurrentAccum = 0.0;
      pIVar2->DragCurrentAccumDirty = false;
    }
    else if ((local_4c != 0.0) || (NAN(local_4c))) {
      pIVar2->DragCurrentAccum = local_4c + pIVar2->DragCurrentAccum;
      pIVar2->DragCurrentAccumDirty = true;
    }
    if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      local_1 = false;
    }
    else {
      local_70 = (char *)0x0;
      if (bVar1) {
        in_stack_ffffffffffffff88 =
             (char *)ImPow((double)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        local_b8 = (float)(ulong)((long)in_RCX - (long)in_RDX);
        dVar8 = (double)in_stack_ffffffffffffff88 + (double)(pIVar2->DragCurrentAccum / local_b8);
        in_stack_ffffffffffffff30 = in_RDX;
        ImSaturate((float)dVar8);
        data_type_00 = (ImGuiDataType)((ulong)dVar8 >> 0x20);
        ImPow(0.0,2.790738e-39);
        local_70 = in_stack_ffffffffffffff88;
      }
      local_68 = (ImVec2 *)
                 RoundScalarWithFormatT<unsigned_long_long,long_long>
                           (in_stack_ffffffffffffff88,data_type_00,in_stack_ffffffffffffff78);
      pIVar2->DragCurrentAccumDirty = false;
      if (bVar1) {
        dVar8 = ImPow((double)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(dVar8 - (double)local_70);
      }
      else {
        pIVar2->DragCurrentAccum =
             pIVar2->DragCurrentAccum - (float)(long)((long)local_68 - *in_RSI);
      }
      if (local_68 == (ImVec2 *)0x0) {
        local_68 = (ImVec2 *)0x0;
      }
      if (((ImVec2 *)*in_RSI != local_68) && (bVar5)) {
        if ((local_68 < in_RDX) ||
           ((((ImVec2 *)*in_RSI < local_68 && (local_4c < 0.0)) && (!bVar6 && !bVar7)))) {
          local_68 = in_RDX;
        }
        if ((in_RCX < local_68) ||
           (((local_68 < (ImVec2 *)*in_RSI && (0.0 < local_4c)) && (!bVar6 && !bVar7)))) {
          local_68 = in_RCX;
        }
      }
      if ((ImVec2 *)*in_RSI == local_68) {
        local_1 = false;
      }
      else {
        *in_RSI = (ulong)local_68;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}